

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::SingleVertexArrayUsageGroup::init
          (SingleVertexArrayUsageGroup *this,EVP_PKEY_CTX *ctx)

{
  int t;
  Usage usage_;
  GLValue min_;
  GLValue max_;
  int in_EAX;
  int iVar1;
  int iVar2;
  MultiVertexArrayTest *this_00;
  long lVar3;
  int *piVar4;
  InputType type;
  long lVar5;
  long lVar6;
  InputType type_00;
  GLValue GVar7;
  GLValue GVar8;
  undefined4 uStack_174;
  undefined4 uStack_164;
  Spec spec;
  string name;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ArraySpec arraySpec;
  
  lVar6 = 0;
  do {
    if (lVar6 == 4) {
      return in_EAX;
    }
    lVar3 = 0;
LAB_005a6dd5:
    if (lVar3 != 2) {
      piVar4 = &DAT_009bcb20;
      lVar5 = 0;
      do {
        if (lVar5 == 1) {
          type_00 = (&DAT_009bcb00)[lVar6];
          iVar1 = deqp::gls::Array::inputTypeSize(type_00);
          iVar1 = iVar1 * 2;
        }
        else {
          if (lVar5 == 4) goto LAB_005a7081;
          iVar1 = *piVar4;
          type_00 = (&DAT_009bcb00)[lVar6];
        }
        iVar2 = deqp::gls::Array::inputTypeSize(type_00);
        typeToString<int>(&local_d0,iVar1);
        std::operator+(&local_b0,"stride",&local_d0);
        std::operator+(&local_90,&local_b0,"_");
        deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_f0,(Array *)(ulong)type_00,type);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec,
                       &local_90,&local_f0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &arraySpec,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec,
                       "_quads");
        t = (&DAT_009bd238)[lVar3];
        typeToString<int>(&local_110,t);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &arraySpec,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&arraySpec);
        std::__cxx11::string::~string((string *)&spec);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        usage_ = this->m_usage;
        GVar7 = deqp::gls::GLValue::getMinValue(type_00);
        GVar8 = deqp::gls::GLValue::getMaxValue(type_00);
        max_._4_4_ = uStack_174;
        max_.type = GVar8.type;
        min_._4_4_ = uStack_164;
        min_.type = GVar7.type;
        min_.field_1 = GVar7.field_1;
        max_.field_1 = GVar8.field_1;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  (&arraySpec,type_00,OUTPUTTYPE_VEC2,STORAGE_BUFFER,usage_,2,0,iVar1,false,min_,
                   max_);
        spec.arrays.
        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        spec.arrays.
        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        spec.arrays.
        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        spec.primitive = PRIMITIVE_TRIANGLES;
        spec.first = 0;
        spec.drawCount = t;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ::push_back(&spec.arrays,&arraySpec);
        if (iVar1 % iVar2 == 0) {
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,&spec,
                     name._M_dataplus._M_p,name._M_dataplus._M_p);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        }
        std::
        _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ::~_Vector_base(&spec.arrays.
                         super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       );
        std::__cxx11::string::~string((string *)&name);
        lVar5 = lVar5 + 1;
        piVar4 = piVar4 + 1;
      } while( true );
    }
    lVar6 = lVar6 + 1;
    in_EAX = 2;
  } while( true );
LAB_005a7081:
  lVar3 = lVar3 + 1;
  goto LAB_005a6dd5;
}

Assistant:

void SingleVertexArrayUsageGroup::init (void)
{
	int					counts[]		= {1, 256};
	int					strides[]		= {0, -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_FIXED, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				const int			stride	= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * 2 : strides[strideNdx]);
				const bool			aligned	= (stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0;
				const std::string	name	= "stride" + typeToString(stride) + "_" + Array::inputTypeToString(inputTypes[inputTypeNdx]) + "_quads" + typeToString(counts[countNdx]);

				MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																Array::OUTPUTTYPE_VEC2,
																Array::STORAGE_BUFFER,
																m_usage,
																2,
																0,
																stride,
																false,
																GLValue::getMinValue(inputTypes[inputTypeNdx]),
																GLValue::getMaxValue(inputTypes[inputTypeNdx]));

				MultiVertexArrayTest::Spec spec;
				spec.primitive	= Array::PRIMITIVE_TRIANGLES;
				spec.drawCount	= counts[countNdx];
				spec.first		= 0;
				spec.arrays.push_back(arraySpec);

				if (aligned)
					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
			}
		}
	}
}